

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O3

void __thiscall OpenMD::Velocitizer::randomizeChargeVelocity(Velocitizer *this,RealType temperature)

{
  SimInfo *info;
  FluctuatingChargeParameters *pFVar1;
  StuntDouble *pSVar2;
  Atom *pAVar3;
  double dVar4;
  result_type_conflict rVar5;
  pointer ppAVar6;
  pointer ppAVar7;
  Molecule *pMVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  ObjectType OVar12;
  FluctuatingChargeConstraints *this_00;
  Molecule *pMVar13;
  long lVar14;
  long lVar15;
  Atom *atom;
  pointer ppSVar16;
  double dVar17;
  MoleculeIterator mi;
  FluctuatingChargeAdapter fqa;
  MoleculeIterator local_88;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_80;
  FluctuatingChargeConstraints *local_68;
  Molecule *local_60;
  normal_distribution<double> local_58;
  
  local_88._M_node = (_Base_ptr)0x0;
  local_58._M_param._M_mean._0_4_ = 0;
  local_58._M_param._M_mean._4_4_ = 0;
  local_58._M_param._M_stddev._0_4_ = 0;
  local_58._M_param._M_stddev._4_4_ = 0x3ff00000;
  local_58._M_saved = 0.0;
  local_58._M_saved_available = false;
  info = this->info_;
  pFVar1 = info->simParams_->flucQpars_;
  this_00 = (FluctuatingChargeConstraints *)operator_new(0x88);
  FluctuatingChargeConstraints::FluctuatingChargeConstraints(this_00,info);
  FluctuatingChargeConstraints::setConstrainRegions
            (this_00,(bool)(pFVar1->ConstrainRegions).super_ParameterBase.field_0x2b);
  iVar10 = FluctuatingChargeConstraints::getNumberOfFlucQConstraints(this_00);
  local_68 = this_00;
  iVar11 = FluctuatingChargeConstraints::getNumberOfFlucQAtoms(this_00);
  pMVar13 = SimInfo::beginMolecule(this->info_,&local_88);
  if (pMVar13 != (Molecule *)0x0) {
    dVar17 = ((double)iVar11 * 0.0019872156 * temperature) / (double)((iVar11 - iVar10) * 2);
    dVar17 = dVar17 + dVar17;
    do {
      ppSVar16 = (pMVar13->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pMVar8 = local_60;
      if (ppSVar16 !=
          (pMVar13->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar2 = *ppSVar16;
        while (local_60 = pMVar13, pSVar2 != (StuntDouble *)0x0) {
          OVar12 = pSVar2->objType_;
          if (OVar12 < otRigidBody) {
            local_80.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)pSVar2[1]._vptr_StuntDouble;
            bVar9 = FluctuatingChargeAdapter::isFluctuatingCharge
                              ((FluctuatingChargeAdapter *)&local_80);
            if (bVar9) {
              dVar4 = dVar17 / *(double *)&pSVar2[1].objType_;
              if (dVar4 < 0.0) {
                dVar4 = sqrt(dVar4);
              }
              else {
                dVar4 = SQRT(dVar4);
              }
              rVar5 = std::normal_distribution<double>::operator()
                                (&local_58,
                                 (this->randNumGen_).
                                 super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,&local_58._M_param);
              *(double *)
               (*(long *)((long)&(pSVar2->snapshotMan_->currentSnapshot_->atomData).flucQVel.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start + pSVar2->storage_) +
               (long)pSVar2->localIndex_ * 8) = rVar5 * dVar4;
            }
            OVar12 = pSVar2->objType_;
          }
          if (OVar12 == otRigidBody) {
            std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
                      (&local_80,
                       (vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&pSVar2[2].mass_);
            ppAVar7 = local_80.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
            ppAVar6 = local_80.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if ((long)local_80.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_80.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                      _M_impl.super__Vector_impl_data._M_start == 0) {
              if (local_80.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                  _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_002b9c24;
            }
            else {
              lVar15 = (long)local_80.
                             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_80.
                             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3;
              lVar14 = 0;
              do {
                pAVar3 = ppAVar6[lVar14];
                local_80.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                .super__Vector_impl_data._M_start = (pointer)pAVar3->atomType_;
                bVar9 = FluctuatingChargeAdapter::isFluctuatingCharge
                                  ((FluctuatingChargeAdapter *)&local_80);
                if (bVar9) {
                  dVar4 = dVar17 / pAVar3->chargeMass_;
                  if (dVar4 < 0.0) {
                    dVar4 = sqrt(dVar4);
                  }
                  else {
                    dVar4 = SQRT(dVar4);
                  }
                  rVar5 = std::normal_distribution<double>::operator()
                                    (&local_58,
                                     (this->randNumGen_).
                                     super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,&local_58._M_param);
                  *(double *)
                   (*(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                     atomData).flucQVel.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (pAVar3->super_StuntDouble).storage_) +
                   (long)(pAVar3->super_StuntDouble).localIndex_ * 8) = dVar4 * rVar5;
                }
                lVar14 = lVar14 + 1;
              } while (lVar15 + (ulong)(lVar15 == 0) != lVar14);
            }
            operator_delete(ppAVar6,(long)ppAVar7 - (long)ppAVar6);
          }
LAB_002b9c24:
          ppSVar16 = ppSVar16 + 1;
          pMVar8 = local_60;
          if (ppSVar16 ==
              (local_60->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) break;
          pMVar13 = local_60;
          pSVar2 = *ppSVar16;
        }
      }
      local_60 = pMVar8;
      pMVar13 = SimInfo::nextMolecule(this->info_,&local_88);
    } while (pMVar13 != (Molecule *)0x0);
  }
  FluctuatingChargeConstraints::applyConstraintsOnChargeVelocities(local_68);
  return;
}

Assistant:

void Velocitizer::randomizeChargeVelocity(RealType temperature) {
    RealType aw2;
    RealType kebar;
    RealType wbar;

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;
    FluctuatingChargeParameters* fqParams;
    FluctuatingChargeConstraints* fqConstraints;

    std::normal_distribution<RealType> normalDistribution {0.0, 1.0};

    Globals* simParams = info_->getSimParams();
    fqParams           = simParams->getFluctuatingChargeParameters();

    fqConstraints = new FluctuatingChargeConstraints(info_);
    fqConstraints->setConstrainRegions(fqParams->getConstrainRegions());

    int nConstrain =
        fqConstraints
            ->getNumberOfFlucQConstraints();  // no of constraints in charge
    int dfRaw = fqConstraints->getNumberOfFlucQAtoms();  // no of FlucQ freedom
    int dfActual = dfRaw - nConstrain;
    kebar        = dfRaw * Constants::kb * temperature / (2 * dfActual);

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        if (sd->isAtom()) {
          Atom* atom                   = static_cast<Atom*>(sd);
          AtomType* atomType           = atom->getAtomType();
          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
          if (fqa.isFluctuatingCharge()) {
            // uses equipartition theory to solve for vbar in angstrom/fs

            aw2  = 2.0 * kebar / atom->getChargeMass();
            wbar = sqrt(aw2);

            // picks random velocities from a gaussian distribution
            // centered on vbar
            atom->setFlucQVel(wbar * normalDistribution(*randNumGen_));
          }
        }

        // randomization of the charge velocities for atoms in the rigidbody

        if (sd->isRigidBody()) {
          RigidBody* rigidbody = static_cast<RigidBody*>(sd);
          vector<Atom*> atomList;
          atomList = rigidbody->getAtoms();

          for (size_t i = 0; i < atomList.size(); ++i) {
            Atom* atom                   = atomList[i];
            AtomType* atomType           = atom->getAtomType();
            FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
            if (fqa.isFluctuatingCharge()) {
              // uses equipartition theory to solve for vbar in angstrom/fs
              aw2  = 2.0 * kebar / atom->getChargeMass();
              wbar = sqrt(aw2);
              // picks random velocities from a gaussian distribution
              // centered on vbar
              atom->setFlucQVel(wbar * normalDistribution(*randNumGen_));
            }
          }
        }
      }
    }
    fqConstraints->applyConstraintsOnChargeVelocities();
  }